

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::swap
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this,size_t _i0,size_t _i1)

{
  reference __a;
  reference __b;
  size_t _i1_local;
  size_t _i0_local;
  PropertyT<OpenMesh::Attributes::StatusInfo> *this_local;
  
  __a = std::
        vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
        ::operator[](&this->data_,_i0);
  __b = std::
        vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
        ::operator[](&this->data_,_i1);
  std::swap<OpenMesh::Attributes::StatusInfo>(__a,__b);
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }